

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftell.c
# Opt level: O1

long ftell(FILE *__stream)

{
  char **mtx;
  int *piVar1;
  long lVar2;
  
  mtx = &__stream->_IO_save_base;
  mtx_lock((mtx_t *)mtx);
  if (__stream->_IO_buf_base + (0x7fffffffffffffff - (long)__stream->_IO_read_base) <
      __stream->_IO_write_ptr + -(long)__stream->_IO_write_base) {
    mtx_unlock((mtx_t *)mtx);
    piVar1 = _PDCLIB_errno_func();
    *piVar1 = 0x22;
    lVar2 = -1;
  }
  else {
    lVar2 = (long)__stream->_IO_write_ptr -
            (long)(__stream->_IO_buf_base +
                  ((int)__stream->_IO_write_base - (int)__stream->_IO_read_base));
    mtx_unlock((mtx_t *)mtx);
  }
  return lVar2;
}

Assistant:

long int ftell( struct _PDCLIB_file_t * stream )
{
    /* ftell() must take into account:
       - the actual *physical* offset of the file, i.e. the offset as recognized
         by the operating system (and stored in stream->pos.offset); and
       - any buffers held by PDCLib, which
         - in case of unwritten buffers, count in *addition* to the offset; or
         - in case of unprocessed pre-read buffers, count in *substraction* to
           the offset. (Remember to count ungetidx into this number.)
       Conveniently, the calculation ( ( bufend - bufidx ) + ungetidx ) results
       in just the right number in both cases:
         - in case of unwritten buffers, ( ( 0 - unwritten ) + 0 )
           i.e. unwritten bytes as negative number
         - in case of unprocessed pre-read, ( ( preread - processed ) + unget )
           i.e. unprocessed bytes as positive number.
       That is how the somewhat obscure return-value calculation works.
    */
    /*  If offset is too large for return type, report error instead of wrong
        offset value.
    */
    long int rc;
    _PDCLIB_LOCK( stream->mtx );

    if ( ( stream->pos.offset - stream->bufend ) > ( LONG_MAX - ( stream->bufidx - stream->ungetidx ) ) )
    {
        /* integer overflow */
        _PDCLIB_UNLOCK( stream->mtx );
        *_PDCLIB_errno_func() = _PDCLIB_ERANGE;
        return -1;
    }

    rc = ( stream->pos.offset - ( ( ( int )stream->bufend - ( int )stream->bufidx ) + stream->ungetidx ) );
    _PDCLIB_UNLOCK( stream->mtx );
    return rc;
}